

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  long lVar1;
  byte __c;
  size_t i;
  ulong n;
  long in_FS_OFFSET;
  char buf [10];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (n = 0; n < value->size_; n = n + 1) {
    __c = Slice::operator[](value,n);
    if ((byte)(__c - 0x20) < 0x5f) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (str,__c);
    }
    else {
      snprintf(buf,10,"\\x%02x",(ulong)__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (str,buf);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      snprintf(buf, sizeof(buf), "\\x%02x",
               static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}